

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TProtocol.h
# Opt level: O2

uint32_t duckdb_apache::thrift::protocol::
         skip<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::DecryptionTransport>>
                   (TCompactProtocolT<duckdb::DecryptionTransport> *prot,TType type)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  TProtocolException *this;
  uint uVar5;
  uint32_t size;
  bool boolv;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  uint32_t size_2;
  
  TProtocol::incrementInputRecursionDepth((TProtocol *)prot);
  switch(type) {
  case T_BOOL:
    uVar2 = TCompactProtocolT<duckdb::DecryptionTransport>::readBool(prot,&boolv);
    break;
  case T_BYTE:
    _boolv = _boolv & 0xffffffffffffff00;
    uVar2 = TCompactProtocolT<duckdb::DecryptionTransport>::readByte(prot,&boolv);
    break;
  case T_DOUBLE:
    uVar2 = TCompactProtocolT<duckdb::DecryptionTransport>::readDouble(prot,(double *)&boolv);
    break;
  default:
    this = (TProtocolException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&boolv,"invalid TType",(allocator *)&size);
    TProtocolException::TProtocolException(this,INVALID_DATA,(string *)&boolv);
    __cxa_throw(this,&TProtocolException::typeinfo,TException::~TException);
  case T_I16:
    uVar2 = TCompactProtocolT<duckdb::DecryptionTransport>::readI16(prot,(int16_t *)&boolv);
    break;
  case T_I32:
    uVar2 = TCompactProtocolT<duckdb::DecryptionTransport>::readI32(prot,(int32_t *)&boolv);
    break;
  case T_I64:
    uVar2 = TCompactProtocolT<duckdb::DecryptionTransport>::readI64(prot,(int64_t *)&boolv);
    break;
  case T_STRING:
    _boolv = (pointer)&local_48;
    local_50 = 0;
    local_48._M_local_buf[0] = '\0';
    uVar2 = TCompactProtocolT<duckdb::DecryptionTransport>::readBinary(prot,(string *)&boolv);
    goto LAB_01e14c5b;
  case T_STRUCT:
    _boolv = (pointer)&local_48;
    local_50 = 0;
    local_48._M_local_buf[0] = '\0';
    uVar3 = TCompactProtocolT<duckdb::DecryptionTransport>::readStructBegin(prot,(string *)&boolv);
    while( true ) {
      uVar4 = TCompactProtocolT<duckdb::DecryptionTransport>::readFieldBegin
                        (prot,(string *)&boolv,&size,(int16_t *)&size_2);
      if (size == 0) break;
      uVar2 = skip<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::DecryptionTransport>>
                        (prot,size);
      uVar3 = uVar2 + uVar4 + uVar3;
    }
    uVar2 = TCompactProtocolT<duckdb::DecryptionTransport>::readStructEnd(prot);
    uVar2 = uVar2 + uVar4 + uVar3;
LAB_01e14c5b:
    std::__cxx11::string::~string((string *)&boolv);
    break;
  case T_MAP:
    uVar2 = TCompactProtocolT<duckdb::DecryptionTransport>::readMapBegin
                      (prot,(TType *)&boolv,&size,&size_2);
    for (uVar5 = 0; uVar5 < size_2; uVar5 = uVar5 + 1) {
      uVar3 = skip<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::DecryptionTransport>>
                        (prot,_boolv);
      uVar4 = skip<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::DecryptionTransport>>
                        (prot,size);
      uVar2 = uVar3 + uVar2 + uVar4;
    }
    break;
  case T_SET:
    uVar2 = TCompactProtocolT<duckdb::DecryptionTransport>::readListBegin
                      (prot,(TType *)&boolv,&size);
    for (uVar5 = 0; uVar5 < size; uVar5 = uVar5 + 1) {
      uVar3 = skip<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::DecryptionTransport>>
                        (prot,_boolv);
      uVar2 = uVar2 + uVar3;
    }
    break;
  case T_LIST:
    uVar2 = TCompactProtocolT<duckdb::DecryptionTransport>::readListBegin
                      (prot,(TType *)&boolv,&size);
    for (uVar5 = 0; uVar5 < size; uVar5 = uVar5 + 1) {
      uVar3 = skip<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::DecryptionTransport>>
                        (prot,_boolv);
      uVar2 = uVar2 + uVar3;
    }
  }
  puVar1 = &(prot->
            super_TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::DecryptionTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
            ).super_TProtocolDefaults.super_TProtocol.input_recursion_depth_;
  *puVar1 = *puVar1 - 1;
  return uVar2;
}

Assistant:

uint32_t skip(Protocol_& prot, TType type) {
  TInputRecursionTracker tracker(prot);

  switch (type) {
  case T_BOOL: {
    bool boolv;
    return prot.readBool(boolv);
  }
  case T_BYTE: {
    int8_t bytev = 0;
    return prot.readByte(bytev);
  }
  case T_I16: {
    int16_t i16;
    return prot.readI16(i16);
  }
  case T_I32: {
    int32_t i32;
    return prot.readI32(i32);
  }
  case T_I64: {
    int64_t i64;
    return prot.readI64(i64);
  }
  case T_DOUBLE: {
    double dub;
    return prot.readDouble(dub);
  }
  case T_STRING: {
    std::string str;
    return prot.readBinary(str);
  }
  case T_STRUCT: {
    uint32_t result = 0;
    std::string name;
    int16_t fid;
    TType ftype;
    result += prot.readStructBegin(name);
    while (true) {
      result += prot.readFieldBegin(name, ftype, fid);
      if (ftype == T_STOP) {
        break;
      }
      result += skip(prot, ftype);
      result += prot.readFieldEnd();
    }
    result += prot.readStructEnd();
    return result;
  }
  case T_MAP: {
    uint32_t result = 0;
    TType keyType;
    TType valType;
    uint32_t i, size;
    result += prot.readMapBegin(keyType, valType, size);
    for (i = 0; i < size; i++) {
      result += skip(prot, keyType);
      result += skip(prot, valType);
    }
    result += prot.readMapEnd();
    return result;
  }
  case T_SET: {
    uint32_t result = 0;
    TType elemType;
    uint32_t i, size;
    result += prot.readSetBegin(elemType, size);
    for (i = 0; i < size; i++) {
      result += skip(prot, elemType);
    }
    result += prot.readSetEnd();
    return result;
  }
  case T_LIST: {
    uint32_t result = 0;
    TType elemType;
    uint32_t i, size;
    result += prot.readListBegin(elemType, size);
    for (i = 0; i < size; i++) {
      result += skip(prot, elemType);
    }
    result += prot.readListEnd();
    return result;
  }
  default:
    break;
  }

  throw TProtocolException(TProtocolException::INVALID_DATA,
                           "invalid TType");
}